

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeView.cc
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
NodeView::get_mappings_tags(NodeView *this,string *datastore_name,int min_read_count)

{
  bool bVar1;
  LinkedReadsDatastore *__k;
  reference ppVar2;
  uint in_ECX;
  size_type *in_RSI;
  size_type __n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  pair<const_unsigned_int,_unsigned_int> *t_1;
  iterator __end1_1;
  iterator __begin1_1;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *__range1_1;
  LinkedTag t;
  ReadMapping mapping;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  tag_counts;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *tags;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *in_stack_fffffffffffffef8;
  __normal_iterator<ReadMapping_*,_std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>
  *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  LinkedTag in_stack_ffffffffffffff0c;
  LinkedReadsDatastore *in_stack_ffffffffffffff10;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *in_stack_ffffffffffffff40;
  _Self in_stack_ffffffffffffff48;
  _Self in_stack_ffffffffffffff50;
  __normal_iterator<ReadMapping_*,_std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>
  local_70 [3];
  reference local_58;
  uint local_1c;
  
  local_1c = in_ECX;
  std::
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
         *)0x47d472);
  __k = WorkSpace::get_linked_reads_datastore
                  ((WorkSpace *)in_stack_ffffffffffffff50._M_node,
                   (string *)in_stack_ffffffffffffff48._M_node);
  __n = *in_RSI;
  if ((long)__n < 1) {
    __n = -__n;
  }
  local_58 = std::
             vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
             ::operator[](&(__k->mapper).reads_in_node,__n);
  local_70[0]._M_current =
       (ReadMapping *)
       std::vector<ReadMapping,_std::allocator<ReadMapping>_>::begin
                 ((vector<ReadMapping,_std::allocator<ReadMapping>_> *)in_stack_fffffffffffffef8);
  std::vector<ReadMapping,_std::allocator<ReadMapping>_>::end
            ((vector<ReadMapping,_std::allocator<ReadMapping>_> *)in_stack_fffffffffffffef8);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff00,
                            (__normal_iterator<ReadMapping_*,_std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>
                             *)in_stack_fffffffffffffef8), bVar1) {
    __gnu_cxx::
    __normal_iterator<ReadMapping_*,_std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>::
    operator*(local_70);
    in_stack_ffffffffffffff10 =
         WorkSpace::get_linked_reads_datastore
                   ((WorkSpace *)in_stack_ffffffffffffff50._M_node,
                    (string *)in_stack_ffffffffffffff48._M_node);
    in_stack_ffffffffffffff0c =
         LinkedReadsDatastore::get_read_tag
                   ((LinkedReadsDatastore *)
                    CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                    (size_t)in_stack_ffffffffffffff00);
    in_stack_ffffffffffffff00 =
         (__normal_iterator<ReadMapping_*,_std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>
          *)std::
            map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
            ::operator[](in_stack_ffffffffffffff40,(key_type_conflict3 *)__k);
    *(mapped_type_conflict *)&in_stack_ffffffffffffff00->_M_current =
         *(mapped_type_conflict *)&in_stack_ffffffffffffff00->_M_current + 1;
    __gnu_cxx::
    __normal_iterator<ReadMapping_*,_std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>::
    operator++(local_70);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x47d5ce);
  std::
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::begin(in_stack_fffffffffffffef8);
  std::
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::end(in_stack_fffffffffffffef8);
  while (bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff50,(_Self *)&stack0xffffffffffffff48
                                ), bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_> *)0x47d618)
    ;
    if (local_1c < ppVar2->second) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff10,
                 (value_type_conflict6 *)
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_> *)
               in_stack_ffffffffffffff00);
  }
  std::
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *)0x47d692);
  return in_RDI;
}

Assistant:

std::vector<LinkedTag> NodeView::get_mappings_tags(std::string datastore_name, int min_read_count) const {

    std::map<LinkedTag, uint32_t> tag_counts;
    for (auto mapping: dg->sdg.ws.get_linked_reads_datastore(datastore_name).mapper.reads_in_node[llabs(id)]){
        auto t = dg->sdg.ws.get_linked_reads_datastore(datastore_name).get_read_tag(mapping.read_id);
        tag_counts[t]++;
    }

    std::vector<LinkedTag> tags;
    for (auto &t: tag_counts) {
        if (t.second > min_read_count) {
            tags.push_back(t.first);
        }
    }
    return tags;
}